

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  bool bVar2;
  uint8_t uVar3;
  ushort uVar4;
  long lVar5;
  roaring_container_iterator_t *extraout_RDX;
  roaring_container_iterator_t *prVar6;
  undefined7 in_register_00000031;
  bitset_container_t *container;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bitset_container_t *bc;
  
  container = (bitset_container_t *)c;
  uVar3 = typecode;
  if ((int)CONCAT71(in_register_00000031,typecode) == 4) {
    uVar3 = *(uint8_t *)((long)c + 8);
    container = *c;
  }
  prVar6 = it;
  if (uVar3 == '\x03') {
    lVar5 = (long)container->cardinality;
    if (lVar5 != 0) {
      uVar4 = *(short *)((long)container->words + lVar5 * 4 + -2) +
              *(short *)((long)container->words + lVar5 * 4 + -4);
      goto LAB_00119c85;
    }
  }
  else {
    if (uVar3 != '\x02') {
      uVar4 = bitset_container_maximum(container);
      prVar6 = extraout_RDX;
      goto LAB_00119c85;
    }
    if ((long)container->cardinality != 0) {
      uVar4 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
      goto LAB_00119c85;
    }
  }
  uVar4 = 0;
LAB_00119c85:
  if (val <= uVar4) {
    if (typecode == '\x03') {
      lVar5 = *(long *)((long)c + 8);
      iVar9 = *c + -1;
      uVar8 = 0;
      do {
        if (iVar9 < (int)uVar8) {
          uVar7 = ~uVar8;
          break;
        }
        uVar7 = uVar8 + iVar9 >> 1;
        uVar1 = *(ushort *)(lVar5 + (ulong)uVar7 * 4);
        if (uVar1 < val) {
          uVar8 = uVar7 + 1;
          bVar2 = true;
        }
        else if (val < uVar1) {
          iVar9 = uVar7 - 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          prVar6 = (roaring_container_iterator_t *)(ulong)uVar7;
        }
        uVar7 = (uint)prVar6;
      } while (bVar2);
      uVar8 = uVar7;
      if (((int)uVar7 < 0) &&
         ((uVar7 == 0xffffffff ||
          (uVar8 = -uVar7 - 2,
          (int)(uint)*(ushort *)(lVar5 + 2 + (ulong)uVar8 * 4) <
          (int)((uint)val - (uint)*(ushort *)(lVar5 + (ulong)uVar8 * 4)))))) {
        uVar8 = 0xffffffff;
        if ((int)~uVar7 < *c) {
          uVar8 = ~uVar7;
        }
      }
      it->index = uVar8;
      uVar1 = *(ushort *)(lVar5 + (long)(int)uVar8 * 4);
      uVar8 = (uint)uVar1;
      if (uVar1 <= val) {
        uVar8 = (uint)val;
      }
    }
    else if (typecode == '\x02') {
      lVar5 = *(long *)((long)c + 8);
      iVar9 = *c + -1;
      uVar8 = 0;
      do {
        if (iVar9 < (int)uVar8) {
          uVar7 = ~uVar8;
          break;
        }
        uVar7 = uVar8 + iVar9 >> 1;
        uVar1 = *(ushort *)(lVar5 + (ulong)(uVar8 + iVar9 & 0xfffffffe));
        if (uVar1 < val) {
          uVar8 = uVar7 + 1;
          bVar2 = true;
        }
        else if (val < uVar1) {
          iVar9 = uVar7 - 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          prVar6 = (roaring_container_iterator_t *)(ulong)uVar7;
        }
        uVar7 = (uint)prVar6;
      } while (bVar2);
      uVar8 = 0xffffffff;
      if ((int)~uVar7 < *c) {
        uVar8 = ~uVar7;
      }
      if (-1 < (int)uVar7) {
        uVar8 = uVar7;
      }
      it->index = uVar8;
      uVar8 = (uint)*(ushort *)(lVar5 + (long)(int)uVar8 * 2);
    }
    else {
      uVar8 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
      it->index = uVar8;
    }
    *value_out = (uint16_t)uVar8;
  }
  return val <= uVar4;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}